

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Function * __thiscall
wasm::Module::addFunction
          (Module *this,unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr)

{
  Function *pFVar1;
  allocator<char> local_41;
  string local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_20;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *local_18;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr_local;
  Module *this_local;
  
  local_18 = curr;
  curr_local = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)this;
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::unique_ptr(&local_20,curr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"addFunction",&local_41);
  pFVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>,std::unordered_map<wasm::Name,wasm::Function*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>>,wasm::Function>
                     (&this->functions,&this->functionsMap,&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_20);
  return pFVar1;
}

Assistant:

Function* Module::addFunction(std::unique_ptr<Function>&& curr) {
  return addModuleElement(
    functions, functionsMap, std::move(curr), "addFunction");
}